

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_type_enum(lysp_ctx *ctx,lysp_stmt *stmt,lysp_type_enum **enums)

{
  lysp_ext_instance **exts;
  lyd_node *plVar1;
  LY_ERR LVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  size_t name_len;
  char *pcVar6;
  char *pcVar7;
  char *format;
  uint32_t substmt_index;
  lysp_type_enum *plVar8;
  ly_stmt stmt_00;
  ly_ctx *plVar9;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  uint16_t *flags;
  long lVar10;
  lysp_stmt *stmt_01;
  
  LVar2 = lysp_stmt_validate_value(ctx,(uint)(stmt->kw == LY_STMT_ENUM) * 2,stmt->arg);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  plVar8 = *enums;
  if (plVar8 == (lysp_type_enum *)0x0) {
    plVar4 = (long *)malloc(0x40);
    if (plVar4 == (long *)0x0) goto LAB_0016b1b7;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    lVar5 = *(long *)&plVar8[-1].flags;
    *(long *)&plVar8[-1].flags = lVar5 + 1;
    plVar4 = (long *)realloc(&plVar8[-1].flags,lVar5 * 0x38 + 0x40);
    if (plVar4 == (long *)0x0) {
      *(long *)&(*enums)[-1].flags = *(long *)&(*enums)[-1].flags + -1;
LAB_0016b1b7:
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_enum");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *enums = (lysp_type_enum *)(plVar4 + 1);
  plVar4[lVar5 * 7 + -2] = 0;
  (plVar4 + lVar5 * 7 + -2)[1] = 0;
  plVar4[lVar5 * 7 + -4] = 0;
  (plVar4 + lVar5 * 7 + -4)[1] = 0;
  plVar4[lVar5 * 7 + -6] = 0;
  (plVar4 + lVar5 * 7 + -6)[1] = 0;
  plVar4[lVar5 * 7] = 0;
  if (stmt->kw == LY_STMT_ENUM) {
    pcVar6 = stmt->arg;
    name_len = strlen(pcVar6);
    LVar2 = lysp_check_enum_name(ctx,pcVar6,name_len);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar9 = (ly_ctx *)0x0;
  }
  else {
    plVar9 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar2 = lydict_insert(plVar9,stmt->arg,0,(char **)(plVar4 + lVar5 * 7 + -6));
  if (LVar2 == LY_SUCCESS) {
    plVar8 = *enums;
    if ((plVar8 != (lysp_type_enum *)0x0) && (lVar10 = *(long *)&plVar8[-1].flags + -1, lVar10 != 0)
       ) {
      pcVar6 = (char *)plVar4[lVar5 * 7 + -6];
      do {
        iVar3 = strcmp(plVar8->name,pcVar6);
        if (iVar3 == 0) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar7 = lyplg_ext_stmt2str(stmt->kw);
          format = "Duplicate identifier \"%s\" of %s statement.";
          goto LAB_0016b4d9;
        }
        plVar8 = plVar8 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    stmt_01 = stmt->child;
    if (stmt_01 != (lysp_stmt *)0x0) {
      flags = (uint16_t *)(plVar4 + lVar5 * 7);
      exts = (lysp_ext_instance **)(flags + -4);
      do {
        stmt_00 = stmt_01->kw;
        if ((int)stmt_00 < 0x230000) {
          substmt_index = (int)flags - 0x28;
          if (stmt_00 == LY_STMT_DESCRIPTION) {
LAB_0016b37e:
            in_R8 = exts;
            LVar2 = lysp_stmt_text_field
                              (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
          }
          else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
            in_R8 = exts;
            LVar2 = lysp_stmt_ext(ctx,stmt_01,stmt->kw,0,exts);
          }
          else {
            if (stmt_00 != LY_STMT_IF_FEATURE) goto LAB_0016b41c;
            plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar1[2].schema < 2) {
              plVar9 = (ly_ctx *)**(undefined8 **)plVar1;
              pcVar7 = lyplg_ext_stmt2str(stmt->kw);
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
              pcVar6 = "if-feature";
              goto LAB_0016b4d9;
            }
            LVar2 = lysp_stmt_qnames(ctx,stmt_01,(lysp_qname **)(flags + -8),(yang_arg)exts,in_R8);
          }
        }
        else if ((int)stmt_00 < 0x2c0000) {
          if (stmt_00 != LY_STMT_POSITION) {
            substmt_index = (int)flags - 0x20;
            if (stmt_00 == LY_STMT_REFERENCE) goto LAB_0016b37e;
LAB_0016b41c:
            if (ctx == (lysp_ctx *)0x0) {
              plVar9 = (ly_ctx *)0x0;
            }
            else {
              plVar9 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            goto LAB_0016b4b5;
          }
          if (stmt->kw == LY_STMT_ENUM) {
            if (ctx == (lysp_ctx *)0x0) {
              plVar9 = (ly_ctx *)0x0;
            }
            else {
              plVar9 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            stmt_00 = LY_STMT_POSITION;
            goto LAB_0016b4b5;
          }
LAB_0016b331:
          in_R8 = exts;
          LVar2 = lysp_stmt_type_enum_value_pos(ctx,stmt_01,(int64_t *)(flags + -0xc),flags,exts);
        }
        else {
          if (stmt_00 != LY_STMT_STATUS) {
            if (stmt_00 != LY_STMT_VALUE) goto LAB_0016b41c;
            if (stmt->kw != LY_STMT_BIT) goto LAB_0016b331;
            if (ctx == (lysp_ctx *)0x0) {
              plVar9 = (ly_ctx *)0x0;
            }
            else {
              plVar9 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            stmt_00 = LY_STMT_VALUE;
LAB_0016b4b5:
            pcVar6 = lyplg_ext_stmt2str(stmt_00);
            pcVar7 = lyplg_ext_stmt2str(stmt->kw);
            format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0016b4d9:
            ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,pcVar7);
            return LY_EVALID;
          }
          LVar2 = lysp_stmt_status(ctx,stmt_01,flags,exts);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        stmt_01 = stmt_01->next;
        if (stmt_01 == (lysp_stmt *)0x0) {
          return LY_SUCCESS;
        }
      } while( true );
    }
    LVar2 = LY_SUCCESS;
  }
  return LVar2;
}

Assistant:

static LY_ERR
lysp_stmt_type_enum(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_type_enum **enums)
{
    struct lysp_type_enum *enm;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, stmt->kw == LY_STMT_ENUM ? Y_STR_ARG : Y_IDENTIF_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *enums, enm, LY_EMEM);

    if (stmt->kw == LY_STMT_ENUM) {
        LY_CHECK_RET(lysp_check_enum_name(ctx, stmt->arg, strlen(stmt->arg)));
    } /* else nothing specific for YANG_BIT */

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &enm->name));
    CHECK_UNIQUENESS(ctx, *enums, name, lyplg_ext_stmt2str(stmt->kw), enm->name);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->dsc, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", lyplg_ext_stmt2str(stmt->kw));
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &enm->iffeatures, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->ref, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &enm->flags, &enm->exts));
            break;
        case LY_STMT_VALUE:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_BIT, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_POSITION:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_ENUM, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &enm->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}